

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O0

void __thiscall
soplex::SVSetBase<double>::
SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
          (SVSetBase<double> *this,
          SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          *old)

{
  double in_RSI;
  SVSetBase<double> *in_RDI;
  ClassArray<soplex::Nonzero<double>_> *unaff_retaddr;
  int in_stack_0000000c;
  ClassSet<soplex::SVSetBase<double>::DLPSV> *in_stack_00000010;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *rhs;
  DLPSV *pfirst;
  IdList<soplex::SVSetBase<double>::DLPSV> *in_stack_ffffffffffffffe0;
  
  ClassArray<soplex::Nonzero<double>_>::ClassArray
            (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_RSI);
  (in_RDI->super_ClassArray<soplex::Nonzero<double>_>)._vptr_ClassArray =
       (_func_int **)&PTR__SVSetBase_00896ce8;
  pfirst = (DLPSV *)&in_RDI->set;
  ClassSet<soplex::SVSetBase<double>::DLPSV>::ClassSet(in_stack_00000010,in_stack_0000000c);
  rhs = (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
         *)&in_RDI->list;
  IdList<soplex::SVSetBase<double>::DLPSV>::IdList
            (in_stack_ffffffffffffffe0,pfirst,(DLPSV *)in_RDI,SUB81((ulong)rhs >> 0x38,0));
  in_RDI->unusedMem = *(int *)((long)in_RSI + 0x58);
  in_RDI->numUnusedMemUpdates = *(int *)((long)in_RSI + 0x5c);
  in_RDI->factor = *(double *)((long)in_RSI + 0x60);
  operator=(in_RDI,rhs);
  return;
}

Assistant:

SVSetBase(const SVSetBase<S>& old)
      : SVSetBaseArray()
      , unusedMem(old.unusedMem)
      , numUnusedMemUpdates(old.numUnusedMemUpdates)
      , factor(old.factor)
   {
      *this = old;

      assert(SVSetBase::isConsistent());
   }